

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigStrSim.c
# Opt level: O0

int Saig_StrSimCountMatchedFlops(Aig_Man_t *p)

{
  Vec_Ptr_t *p_00;
  int iVar1;
  Aig_Obj_t *pAVar2;
  int local_20;
  int local_1c;
  int Counter;
  int i;
  Aig_Obj_t *pObj;
  Aig_Man_t *p_local;
  
  local_20 = 0;
  for (local_1c = 0; iVar1 = Saig_ManRegNum(p), local_1c < iVar1; local_1c = local_1c + 1) {
    p_00 = p->vCis;
    iVar1 = Saig_ManPiNum(p);
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p_00,local_1c + iVar1);
    pAVar2 = Aig_ObjRepr(p,pAVar2);
    if (pAVar2 != (Aig_Obj_t *)0x0) {
      local_20 = local_20 + 1;
    }
  }
  return local_20;
}

Assistant:

int Saig_StrSimCountMatchedFlops( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i, Counter = 0;
    Saig_ManForEachLo( p, pObj, i )
        if ( Aig_ObjRepr(p, pObj) )
            Counter++;
    return Counter;
}